

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O1

BlockDataPtr
vkt::ssbo::anon_unknown_15::getBlockDataPtr
          (BufferLayout *layout,BlockLayoutEntry *blockLayout,void *ptr,int bufferSize)

{
  int iVar1;
  int *piVar2;
  pointer pBVar3;
  bool bVar4;
  int iVar5;
  int *piVar6;
  ulong uVar7;
  BlockDataPtr BVar8;
  
  piVar6 = (blockLayout->activeVarIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (blockLayout->activeVarIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar4 = piVar6 != piVar2;
  if (piVar6 == piVar2) {
LAB_006b8db3:
    if (!bVar4) {
      uVar7 = 0;
      goto LAB_006b8dda;
    }
  }
  else {
    pBVar3 = (layout->bufferVars).
             super__Vector_base<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((pBVar3[*piVar6].arraySize != 0) && (pBVar3[*piVar6].topLevelArraySize != 0)) {
      while( true ) {
        piVar6 = piVar6 + 1;
        bVar4 = piVar6 != piVar2;
        if (piVar6 == piVar2) break;
        if ((pBVar3[*piVar6].arraySize == 0) || (pBVar3[*piVar6].topLevelArraySize == 0)) break;
      }
      goto LAB_006b8db3;
    }
  }
  iVar1 = blockLayout->size;
  iVar5 = getUnsizedArrayStride(layout,blockLayout);
  uVar7 = (long)(bufferSize - iVar1) / (long)(int)(iVar5 + (uint)(iVar5 == 0)) << 0x20;
LAB_006b8dda:
  BVar8._8_8_ = (uint)bufferSize | uVar7;
  BVar8.ptr = ptr;
  return BVar8;
}

Assistant:

BlockDataPtr getBlockDataPtr (const BufferLayout& layout, const BlockLayoutEntry& blockLayout, void* ptr, int bufferSize)
{
	const bool	isLastUnsized	= hasUnsizedArray(layout, blockLayout);
	const int	baseSize		= blockLayout.size;

	if (isLastUnsized)
	{
		const int		lastArrayStride	= getUnsizedArrayStride(layout, blockLayout);
		const int		lastArraySize	= (bufferSize-baseSize) / (lastArrayStride ? lastArrayStride : 1);

		DE_ASSERT(baseSize + lastArraySize*lastArrayStride == bufferSize);

		return BlockDataPtr(ptr, bufferSize, lastArraySize);
	}
	else
		return BlockDataPtr(ptr, bufferSize, 0);
}